

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffprec(fitsfile *fptr,char *card,int *status)

{
  int iVar1;
  size_t sVar2;
  int local_a4;
  int keylength;
  long nblocks;
  size_t ii;
  size_t len;
  char tcard [81];
  int *status_local;
  char *card_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    if (fptr->HDUposition != fptr->Fptr->curhdu) {
      ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    }
    if ((fptr->Fptr->datastart - fptr->Fptr->headend == 0x50) &&
       (iVar1 = ffiblk(fptr,1,0,status), 0 < iVar1)) {
      fptr_local._4_4_ = *status;
    }
    else {
      strncpy((char *)&len,card,0x50);
      tcard[0x48] = '\0';
      sVar2 = strlen((char *)&len);
      for (nblocks = 0; (ulong)nblocks < sVar2; nblocks = nblocks + 1) {
        if ((tcard[nblocks + -8] < ' ') || ('~' < tcard[nblocks + -8])) {
          tcard[nblocks + -8] = ' ';
        }
      }
      while (nblocks = sVar2, (ulong)nblocks < 0x50) {
        tcard[nblocks + -8] = ' ';
        sVar2 = nblocks + 1;
      }
      sVar2 = strcspn((char *)&len,"=");
      local_a4 = (int)sVar2;
      if (local_a4 == 0x50) {
        local_a4 = 8;
      }
      iVar1 = fits_strncasecmp("COMMENT ",(char *)&len,8);
      if ((((iVar1 == 0) || (iVar1 = fits_strncasecmp("HISTORY ",(char *)&len,8), iVar1 == 0)) ||
          (iVar1 = fits_strncasecmp("        ",(char *)&len,8), iVar1 == 0)) ||
         (iVar1 = fits_strncasecmp("CONTINUE",(char *)&len,8), iVar1 == 0)) {
        local_a4 = 8;
      }
      for (nblocks = 0; (ulong)nblocks < (ulong)(long)local_a4; nblocks = nblocks + 1) {
        iVar1 = toupper((int)tcard[nblocks + -8]);
        tcard[nblocks + -8] = (char)iVar1;
      }
      fftkey((char *)&len,status);
      ffmbyt(fptr,fptr->Fptr->headend,1,status);
      ffpbyt(fptr,0x50,&len,status);
      if (*status < 1) {
        fptr->Fptr->headend = fptr->Fptr->headend + 0x50;
      }
      fptr_local._4_4_ = *status;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffprec(fitsfile *fptr,     /* I - FITS file pointer        */
           const char *card,   /* I - string to be written     */
           int *status)        /* IO - error status            */
/*
  write a keyword record (80 bytes long) to the end of the header
*/
{
    char tcard[FLEN_CARD];
    size_t len, ii;
    long nblocks;
    int keylength;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if ( ((fptr->Fptr)->datastart - (fptr->Fptr)->headend) == 80) /* no room */
    {
        nblocks = 1;
        if (ffiblk(fptr, nblocks, 0, status) > 0) /* insert 2880-byte block */
            return(*status);  
    }

    strncpy(tcard,card,80);
    tcard[80] = '\0';

    len = strlen(tcard);

    /* silently replace any illegal characters with a space */
    for (ii=0; ii < len; ii++)   
        if (tcard[ii] < ' ' || tcard[ii] > 126) tcard[ii] = ' ';

    for (ii=len; ii < 80; ii++)    /* fill card with spaces if necessary */
        tcard[ii] = ' ';

    keylength = strcspn(tcard, "=");   /* support for free-format keywords */
    if (keylength == 80) keylength = 8;
    
    /* test for the common commentary keywords which by definition have 8-char names */
    if ( !fits_strncasecmp( "COMMENT ", tcard, 8) || !fits_strncasecmp( "HISTORY ", tcard, 8) ||
         !fits_strncasecmp( "        ", tcard, 8) || !fits_strncasecmp( "CONTINUE", tcard, 8) )
	 keylength = 8;

    for (ii=0; ii < keylength; ii++)       /* make sure keyword name is uppercase */
        tcard[ii] = toupper(tcard[ii]);

    fftkey(tcard, status);        /* test keyword name contains legal chars */

/*  no need to do this any more, since any illegal characters have been removed
    fftrec(tcard, status);  */        /* test rest of keyword for legal chars */

    ffmbyt(fptr, (fptr->Fptr)->headend, IGNORE_EOF, status); /* move to end */

    ffpbyt(fptr, 80, tcard, status);   /* write the 80 byte card */

    if (*status <= 0)
       (fptr->Fptr)->headend += 80;    /* update end-of-header position */

    return(*status);
}